

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::CardinalityInterface> * __thiscall
testing::internal::linked_ptr<const_testing::CardinalityInterface>::operator=
          (linked_ptr<const_testing::CardinalityInterface> *this,
          linked_ptr<const_testing::CardinalityInterface> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::CardinalityInterface_const>::copy<testing::CardinalityInterface_const>
              ((linked_ptr<testing::CardinalityInterface_const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }